

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O1

void __thiscall
Assimp::STLExporter::STLExporter
          (STLExporter *this,char *_filename,aiScene *pScene,bool exportPointClouds,bool binary)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ulong uVar4;
  char buf [80];
  locale local_c0 [12];
  int local_b4;
  locale local_b0 [8];
  string local_a8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  std::__cxx11::string::string((string *)&this->filename,_filename,(allocator *)&local_a8);
  (this->endl)._M_dataplus._M_p = (pointer)&(this->endl).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->endl,"\n","");
  std::locale::locale(local_c0,"C");
  std::ios::imbue(local_b0);
  std::locale::~locale(local_b0);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  if (binary) {
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8.field_2._8_8_ = 0;
    local_a8._M_dataplus._M_p = (pointer)0x6353706d69737341;
    local_a8._M_string_length = 0x656e65;
    std::ostream::write((char *)this,(long)&local_a8);
    if ((ulong)pScene->mNumMeshes == 0) {
      local_b4 = 0;
    }
    else {
      uVar4 = 0;
      local_b4 = 0;
      do {
        if (pScene->mMeshes[uVar4]->mNumFaces != 0) {
          uVar2 = pScene->mMeshes[uVar4]->mNumFaces;
          local_b4 = local_b4 + uVar2 + (uVar2 == 0);
        }
        uVar4 = uVar4 + 1;
      } while (pScene->mNumMeshes != uVar4);
    }
    std::ostream::write((char *)this,(long)&local_b4);
    if (exportPointClouds) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"This functionality is not yet implemented for binary output.",
                 "");
      std::runtime_error::runtime_error(this_00,(string *)local_50);
      *(undefined ***)this_00 = &PTR__runtime_error_00900168;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (pScene->mNumMeshes != 0) {
      uVar4 = 0;
      do {
        WriteMeshBinary(this,pScene->mMeshes[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar4 < pScene->mNumMeshes);
    }
  }
  else {
    paVar1 = &local_a8.field_2;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    if (exportPointClouds) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"Assimp_Pointcloud","");
      WritePointCloud(this,&local_a8,pScene);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"AssimpScene","");
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"solid",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      if (pScene->mNumMeshes != 0) {
        uVar4 = 0;
        do {
          WriteMesh(this,pScene->mMeshes[uVar4]);
          uVar4 = uVar4 + 1;
        } while (uVar4 < pScene->mNumMeshes);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"endsolid",8);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,local_a8._M_dataplus._M_p,local_a8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  std::locale::~locale(local_c0);
  return;
}

Assistant:

STLExporter::STLExporter(const char* _filename, const aiScene* pScene, bool exportPointClouds, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);
    if (binary) {
        char buf[80] = {0} ;
        buf[0] = 'A'; buf[1] = 's'; buf[2] = 's'; buf[3] = 'i'; buf[4] = 'm'; buf[5] = 'p';
        buf[6] = 'S'; buf[7] = 'c'; buf[8] = 'e'; buf[9] = 'n'; buf[10] = 'e';
        mOutput.write(buf, 80);
        unsigned int meshnum = 0;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            for (unsigned int j = 0; j < pScene->mMeshes[i]->mNumFaces; ++j) {
                meshnum++;
            }
        }
        AI_SWAP4(meshnum);
        mOutput.write((char *)&meshnum, 4);

        if (exportPointClouds) {
            throw DeadlyExportError("This functionality is not yet implemented for binary output.");
        }

        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMeshBinary(pScene->mMeshes[i]);
        }
    } else {

        // Exporting only point clouds
        if (exportPointClouds) {
            WritePointCloud("Assimp_Pointcloud", pScene );
            return;
        } 

        // Export the assimp mesh 
        const std::string name = "AssimpScene";
        mOutput << SolidToken << " " << name << endl;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMesh(pScene->mMeshes[ i ]);
        }
        mOutput << EndSolidToken << name << endl;
    }
}